

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>
fmt::v8::detail::
write_int_noinline<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned__int128>
          (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> out,
          write_int_arg<unsigned___int128> arg,basic_format_specs<char8_t> *specs,locale_ref loc)

{
  presentation_type pVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 value [16];
  undefined1 n [16];
  undefined1 value_00 [16];
  uint uVar5;
  int iVar6;
  char *digits;
  back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> bVar7;
  char8_t *pcVar8;
  byte *pbVar9;
  char *pcVar10;
  uint uVar11;
  char *digits_1;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  detail *pdVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  bool bVar19;
  format_decimal_result<char8_t_*> fVar20;
  undefined8 in_stack_ffffffffffffff28;
  write_int_data<char8_t> local_c8;
  undefined1 local_b8 [40];
  ulong local_90;
  int local_88;
  bool local_84;
  
  pVar1 = specs->type;
  switch(pVar1) {
  case none:
  case dec:
    if (((specs->field_0xa & 1) != 0) &&
       (value._8_8_ = out.container, value._0_8_ = in_stack_ffffffffffffff28,
       bVar18 = write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned__int128,char8_t>
                          ((detail *)&stack0xffffffffffffff30,
                           (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_> *)
                           (detail *)arg.abs_value,(unsigned___int128)value,arg.abs_value._8_4_,
                           (basic_format_specs<char8_t> *)(ulong)arg.prefix,(locale_ref)specs),
       bVar18)) {
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)out.container;
    }
    n._8_8_ = out.container;
    n._0_8_ = in_stack_ffffffffffffff28;
    iVar6 = count_digits_fallback<unsigned__int128>((detail *)arg.abs_value,(unsigned___int128)n);
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char8_t>::write_int_data(&local_c8,iVar6,arg.prefix,specs);
      local_b8._0_4_ = arg.prefix;
      local_b8._8_8_ = local_c8.size;
      local_b8._16_8_ = local_c8.padding;
      local_90 = arg.abs_value._8_8_;
      local_b8._32_8_ = (detail *)arg.abs_value;
      local_88 = iVar6;
      bVar7 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                        (out,specs,local_c8.size,local_c8.size,(anon_class_64_3_4ecd7a16 *)local_b8)
      ;
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar7.container;
    }
    if (-1 < iVar6) {
      bVar7.container = out.container;
      if ((arg.prefix != 0) &&
         (uVar11 = arg.prefix & 0xffffff,
         ((undefined1  [32])arg & (undefined1  [32])0xffffff) != (undefined1  [32])0x0)) {
        do {
          if ((out.container)->capacity_ < (out.container)->size_ + 1) {
            (**(out.container)->_vptr_buffer)(out.container);
          }
          sVar2 = (out.container)->size_;
          (out.container)->size_ = sVar2 + 1;
          (out.container)->ptr_[sVar2] = (char8_t)uVar11;
          bVar18 = 0xff < uVar11;
          uVar11 = uVar11 >> 8;
        } while (bVar18);
      }
      value_00._8_8_ = bVar7.container;
      value_00._0_8_ = in_stack_ffffffffffffff28;
      fVar20 = format_decimal<char8_t,unsigned__int128>
                         ((detail *)local_b8,(char8_t *)(detail *)arg.abs_value,
                          (unsigned___int128)value_00,arg.abs_value._8_4_);
      bVar7 = copy_str_noinline<char8_t,char8_t*,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                        ((char8_t *)local_b8,fVar20.end,out);
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar7.container;
    }
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x195,"negative value");
  case oct:
    uVar12 = arg.abs_value._8_8_;
    pdVar15 = (detail *)arg.abs_value;
    lVar16 = 0;
    do {
      lVar17 = lVar16;
      uVar3 = uVar12 << 0x3d;
      lVar16 = lVar17 + 1;
      bVar18 = (detail *)0x7 < pdVar15;
      bVar19 = uVar12 != 0;
      uVar4 = -uVar12;
      uVar12 = uVar12 >> 3;
      pdVar15 = (detail *)(uVar3 | (ulong)pdVar15 >> 3);
    } while (bVar19 || uVar4 < bVar18);
    iVar6 = (int)lVar16;
    if (((specs->field_0x9 & 0x80) != 0) &&
       (((detail *)arg.abs_value != (detail *)0x0 || arg.abs_value._8_8_ != 0) &&
        specs->precision <= iVar6)) {
      uVar11 = 0x3000;
      if (arg.prefix == 0) {
        uVar11 = 0x30;
      }
      arg.prefix = (uVar11 | arg.prefix) + 0x1000000;
    }
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char8_t>::write_int_data(&local_c8,iVar6,arg.prefix,specs);
      local_b8._8_8_ = local_c8.size;
      local_b8._16_8_ = local_c8.padding;
      local_90 = arg.abs_value._8_8_;
      local_b8._32_8_ = (detail *)arg.abs_value;
      local_b8._0_4_ = arg.prefix;
      local_88 = iVar6;
      bVar7 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_4_>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_4_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                        (out,specs,local_c8.size,local_c8.size,(anon_class_64_3_4ecd7a16 *)local_b8)
      ;
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar7.container;
    }
    if ((arg.prefix != 0) && (uVar11 = arg.prefix & 0xffffff, (arg.prefix & 0xffffff) != 0)) {
      do {
        if ((out.container)->capacity_ < (out.container)->size_ + 1) {
          (**(out.container)->_vptr_buffer)(out.container);
        }
        sVar2 = (out.container)->size_;
        (out.container)->size_ = sVar2 + 1;
        (out.container)->ptr_[sVar2] = (char8_t)uVar11;
        bVar18 = 0xff < uVar11;
        uVar11 = uVar11 >> 8;
      } while (bVar18);
    }
    sVar2 = (out.container)->size_;
    uVar12 = sVar2 + lVar16;
    if ((out.container)->capacity_ < uVar12) {
      pcVar8 = (char8_t *)0x0;
    }
    else {
      (out.container)->size_ = uVar12;
      pcVar8 = (out.container)->ptr_ + sVar2;
    }
    if (pcVar8 != (char8_t *)0x0) {
      pbVar9 = (byte *)(pcVar8 + lVar16);
      do {
        pbVar9 = pbVar9 + -1;
        uVar12 = arg.abs_value._8_8_ << 0x3d;
        *pbVar9 = (byte)(detail *)arg.abs_value & 7 | 0x30;
        bVar18 = ((detail *)arg.abs_value < (detail *)0x8) <= arg.abs_value._8_8_;
        arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 3;
        arg.abs_value._0_8_ = (detail *)(uVar12 | (ulong)(detail *)arg.abs_value >> 3);
      } while (bVar18);
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)out.container;
    }
    pbVar9 = local_b8 + lVar17;
    pcVar10 = local_b8 + lVar17 + 1;
    do {
      *pbVar9 = (byte)(detail *)arg.abs_value & 7 | 0x30;
      uVar12 = arg.abs_value._8_8_ << 0x3d;
      pbVar9 = pbVar9 + -1;
      bVar18 = (detail *)0x7 < (detail *)arg.abs_value;
      bVar19 = arg.abs_value._8_8_ != 0;
      uVar3 = -arg.abs_value._8_8_;
      arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 3;
      arg.abs_value._0_8_ = (detail *)(uVar12 | (ulong)(detail *)arg.abs_value >> 3);
    } while (bVar19 || uVar3 < bVar18);
    break;
  case hex_lower:
  case hex_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar5 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
      uVar11 = uVar5 << 8;
      if (arg.prefix == 0) {
        uVar11 = uVar5;
      }
      arg.prefix = (uVar11 | arg.prefix) + 0x2000000;
    }
    uVar12 = arg.abs_value._8_8_;
    pdVar15 = (detail *)arg.abs_value;
    lVar16 = 0;
    do {
      lVar17 = lVar16;
      uVar3 = uVar12 << 0x3c;
      lVar16 = lVar17 + 1;
      bVar18 = (detail *)0xf < pdVar15;
      bVar19 = uVar12 != 0;
      uVar4 = -uVar12;
      uVar12 = uVar12 >> 4;
      pdVar15 = (detail *)(uVar3 | (ulong)pdVar15 >> 4);
    } while (bVar19 || uVar4 < bVar18);
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char8_t>::write_int_data(&local_c8,(int)lVar16,arg.prefix,specs);
      local_b8._8_8_ = local_c8.size;
      local_b8._16_8_ = local_c8.padding;
      local_90 = arg.abs_value._8_8_;
      local_b8._32_8_ = (detail *)arg.abs_value;
      local_b8._0_4_ = arg.prefix;
      local_88 = (int)lVar16;
      local_84 = pVar1 == hex_upper;
      bVar7 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_2_>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_2_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                        (out,specs,local_c8.size,local_c8.size,(anon_class_64_3_4ecd7a16 *)local_b8)
      ;
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar7.container;
    }
    if ((arg.prefix != 0) && (uVar11 = arg.prefix & 0xffffff, (arg.prefix & 0xffffff) != 0)) {
      do {
        if ((out.container)->capacity_ < (out.container)->size_ + 1) {
          (**(out.container)->_vptr_buffer)(out.container);
        }
        sVar2 = (out.container)->size_;
        (out.container)->size_ = sVar2 + 1;
        (out.container)->ptr_[sVar2] = (char8_t)uVar11;
        bVar18 = 0xff < uVar11;
        uVar11 = uVar11 >> 8;
      } while (bVar18);
    }
    sVar2 = (out.container)->size_;
    uVar12 = sVar2 + lVar16;
    if ((out.container)->capacity_ < uVar12) {
      pcVar8 = (char8_t *)0x0;
    }
    else {
      (out.container)->size_ = uVar12;
      pcVar8 = (out.container)->ptr_ + sVar2;
    }
    if (pcVar8 != (char8_t *)0x0) {
      pcVar10 = "0123456789abcdef";
      if (pVar1 == hex_upper) {
        pcVar10 = "0123456789ABCDEF";
      }
      pcVar13 = pcVar8 + lVar16;
      do {
        pcVar13 = pcVar13 + -1;
        uVar12 = arg.abs_value._8_8_ << 0x3c;
        *pcVar13 = pcVar10[(uint)(detail *)arg.abs_value & 0xf];
        bVar18 = ((detail *)arg.abs_value < (detail *)0x10) <= arg.abs_value._8_8_;
        arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 4;
        arg.abs_value._0_8_ = (detail *)(uVar12 | (ulong)(detail *)arg.abs_value >> 4);
      } while (bVar18);
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)out.container;
    }
    pcVar13 = local_b8 + lVar17;
    pcVar10 = local_b8 + lVar17 + 1;
    pcVar14 = "0123456789abcdef";
    if (pVar1 == hex_upper) {
      pcVar14 = "0123456789ABCDEF";
    }
    do {
      *pcVar13 = pcVar14[(uint)(detail *)arg.abs_value & 0xf];
      uVar12 = arg.abs_value._8_8_ << 0x3c;
      pcVar13 = pcVar13 + -1;
      bVar18 = (detail *)0xf < (detail *)arg.abs_value;
      bVar19 = arg.abs_value._8_8_ != 0;
      uVar3 = -arg.abs_value._8_8_;
      arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 4;
      arg.abs_value._0_8_ = (detail *)(uVar12 | (ulong)(detail *)arg.abs_value >> 4);
    } while (bVar19 || uVar3 < bVar18);
    break;
  case bin_lower:
  case bin_upper:
    if ((specs->field_0x9 & 0x80) != 0) {
      uVar5 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
      uVar11 = uVar5 << 8;
      if (arg.prefix == 0) {
        uVar11 = uVar5;
      }
      arg.prefix = (uVar11 | arg.prefix) + 0x2000000;
    }
    uVar12 = arg.abs_value._8_8_;
    pdVar15 = (detail *)arg.abs_value;
    lVar16 = 0;
    do {
      lVar17 = lVar16;
      uVar3 = uVar12 << 0x3f;
      lVar16 = lVar17 + 1;
      bVar18 = (detail *)0x1 < pdVar15;
      bVar19 = uVar12 != 0;
      uVar4 = -uVar12;
      uVar12 = uVar12 >> 1;
      pdVar15 = (detail *)(uVar3 | (ulong)pdVar15 >> 1);
    } while (bVar19 || uVar4 < bVar18);
    if (specs->precision != -1 || specs->width != 0) {
      write_int_data<char8_t>::write_int_data(&local_c8,(int)lVar16,arg.prefix,specs);
      local_b8._8_8_ = local_c8.size;
      local_b8._16_8_ = local_c8.padding;
      local_90 = arg.abs_value._8_8_;
      local_b8._32_8_ = (detail *)arg.abs_value;
      local_b8._0_4_ = arg.prefix;
      local_88 = (int)lVar16;
      bVar7 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_3_>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,int,unsigned_int,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::write_int<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,unsigned__int128>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,fmt::v8::detail::write_int_arg<unsigned__int128>,fmt::v8::basic_format_specs<char8_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_3_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                        (out,specs,local_c8.size,local_c8.size,(anon_class_64_3_4ecd7a16 *)local_b8)
      ;
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar7.container;
    }
    if ((arg.prefix != 0) && (uVar11 = arg.prefix & 0xffffff, (arg.prefix & 0xffffff) != 0)) {
      do {
        if ((out.container)->capacity_ < (out.container)->size_ + 1) {
          (**(out.container)->_vptr_buffer)(out.container);
        }
        sVar2 = (out.container)->size_;
        (out.container)->size_ = sVar2 + 1;
        (out.container)->ptr_[sVar2] = (char8_t)uVar11;
        bVar18 = 0xff < uVar11;
        uVar11 = uVar11 >> 8;
      } while (bVar18);
    }
    sVar2 = (out.container)->size_;
    uVar12 = sVar2 + lVar16;
    if ((out.container)->capacity_ < uVar12) {
      pcVar8 = (char8_t *)0x0;
    }
    else {
      (out.container)->size_ = uVar12;
      pcVar8 = (out.container)->ptr_ + sVar2;
    }
    if (pcVar8 != (char8_t *)0x0) {
      pbVar9 = (byte *)(pcVar8 + lVar16);
      do {
        pbVar9 = pbVar9 + -1;
        uVar12 = arg.abs_value._8_8_ << 0x3f;
        *pbVar9 = (byte)(detail *)arg.abs_value & 1 | 0x30;
        bVar18 = ((detail *)arg.abs_value < (detail *)0x2) <= arg.abs_value._8_8_;
        arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 1;
        arg.abs_value._0_8_ = (detail *)(uVar12 | (ulong)(detail *)arg.abs_value >> 1);
      } while (bVar18);
      return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)out.container;
    }
    pbVar9 = local_b8 + lVar17;
    pcVar10 = local_b8 + lVar17 + 1;
    do {
      *pbVar9 = (byte)(detail *)arg.abs_value & 1 | 0x30;
      uVar12 = arg.abs_value._8_8_ << 0x3f;
      pbVar9 = pbVar9 + -1;
      bVar18 = (detail *)0x1 < (detail *)arg.abs_value;
      bVar19 = arg.abs_value._8_8_ != 0;
      uVar3 = -arg.abs_value._8_8_;
      arg.abs_value._8_8_ = arg.abs_value._8_8_ >> 1;
      arg.abs_value._0_8_ = (detail *)(uVar12 | (ulong)(detail *)arg.abs_value >> 1);
    } while (bVar19 || uVar3 < bVar18);
    break;
  default:
    fmt::v8::detail::throw_format_error("invalid type specifier");
  case chr:
    local_b8[0] = (char)arg.abs_value;
    bVar7 = write_padded<(fmt::v8::align::type)1,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::detail::write_char<char8_t,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t,fmt::v8::basic_format_specs<char8_t>const&)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>)_1_&>
                      (out,specs,1,1,(anon_class_1_1_a8c68091 *)local_b8);
    return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar7.container;
  }
  bVar7 = copy_str_noinline<char8_t,char*,std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>>
                    (local_b8,pcVar10,out);
  return (back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>)bVar7.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}